

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemSetRowSet(Mem *pMem)

{
  sqlite3 *db;
  int iVar1;
  char *p;
  int iVar2;
  
  db = pMem->db;
  sqlite3VdbeMemRelease(pMem);
  p = (char *)sqlite3DbMallocRawNN(db,0x38);
  if (p == (char *)0x0) {
    iVar2 = 7;
  }
  else {
    iVar1 = sqlite3DbMallocSize(db,p);
    p[0] = '\0';
    p[1] = '\0';
    p[2] = '\0';
    p[3] = '\0';
    p[4] = '\0';
    p[5] = '\0';
    p[6] = '\0';
    p[7] = '\0';
    *(sqlite3 **)(p + 8) = db;
    p[0x28] = '\0';
    p[0x29] = '\0';
    p[0x2a] = '\0';
    p[0x2b] = '\0';
    p[0x2c] = '\0';
    p[0x2d] = '\0';
    p[0x2e] = '\0';
    p[0x2f] = '\0';
    p[0x10] = '\0';
    p[0x11] = '\0';
    p[0x12] = '\0';
    p[0x13] = '\0';
    p[0x14] = '\0';
    p[0x15] = '\0';
    p[0x16] = '\0';
    p[0x17] = '\0';
    p[0x18] = '\0';
    p[0x19] = '\0';
    p[0x1a] = '\0';
    p[0x1b] = '\0';
    p[0x1c] = '\0';
    p[0x1d] = '\0';
    p[0x1e] = '\0';
    p[0x1f] = '\0';
    *(char **)(p + 0x20) = p + 0x38;
    iVar2 = 0;
    *(short *)(p + 0x30) = (short)(((long)iVar1 - 0x38U) / 0x18);
    p[0x32] = '\x01';
    p[0x33] = '\0';
    p[0x34] = '\0';
    p[0x35] = '\0';
    p[0x36] = '\0';
    p[0x37] = '\0';
    pMem->z = p;
    pMem->flags = 0x410;
    pMem->xDel = sqlite3RowSetDelete;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetRowSet(Mem *pMem){
  sqlite3 *db = pMem->db;
  RowSet *p;
  assert( db!=0 );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  sqlite3VdbeMemRelease(pMem);
  p = sqlite3RowSetInit(db);
  if( p==0 ) return SQLITE_NOMEM;
  pMem->z = (char*)p;
  pMem->flags = MEM_Blob|MEM_Dyn;
  pMem->xDel = sqlite3RowSetDelete;
  return SQLITE_OK;
}